

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall
phosg::BitmapImage::BitmapImage(BitmapImage *this,char *filename,size_t width,size_t height)

{
  uint8_t *data;
  pointer f_00;
  size_t size;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> f;
  size_t height_local;
  size_t width_local;
  char *filename_local;
  BitmapImage *this_local;
  
  f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl = (_IO_FILE *)height;
  BitmapImage(this,width,height);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,filename,&local_59);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"rb",&local_91);
  fopen_unique((phosg *)local_38,&local_58,&local_90,(FILE *)0x0);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::allocator<char>::~allocator(&local_91);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::allocator<char>::~allocator(&local_59);
  f_00 = ::std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::get
                   ((unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *)local_38);
  data = this->data;
  size = get_data_size(this);
  freadx(f_00,data,size);
  ::std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::~unique_ptr
            ((unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *)local_38);
  return;
}

Assistant:

BitmapImage::BitmapImage(const char* filename, size_t width, size_t height)
    : BitmapImage(width, height) {
  auto f = fopen_unique(filename, "rb");
  freadx(f.get(), this->data, this->get_data_size());
}